

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O2

Id dxil_spv::build_constant_expression(Impl *impl,ConstantExpr *cexpr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  TypeID TVar6;
  Id IVar7;
  StorageClass SVar8;
  uint uVar9;
  Id IVar10;
  Id IVar11;
  uint uVar12;
  Type *pTVar13;
  Constant *pCVar14;
  APInt *pAVar15;
  uint64_t uVar16;
  ConstantExpr *pCVar17;
  Constant *this;
  Type *pTVar18;
  PointerType *this_00;
  PointerType *this_01;
  LoggingCallback p_Var19;
  void *pvVar20;
  Operation *pOVar21;
  Builder *pBVar22;
  mapped_type *pmVar23;
  mapped_type *pmVar24;
  int iVar25;
  bool is_signed;
  char *__ptr;
  uint32_t i;
  Op op;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  size_t sStack_1070;
  Op local_1050;
  bool local_104c;
  ulong local_1048;
  Id local_1040;
  Id local_103c;
  char buffer [4096];
  
  uVar5 = LLVMBC::ConstantExpr::getOpcode(cexpr);
  if (0x11 < uVar5 - 0x12d) {
    if (0xc < uVar5 - 0x65) {
      if (uVar5 != 200) {
        p_Var19 = get_thread_log_callback();
        if (p_Var19 == (LoggingCallback)0x0) {
          __ptr = "[ERROR]: Unknown constant-expr.\n";
          sStack_1070 = 0x20;
          goto LAB_00148fc5;
        }
        builtin_strncpy(buffer,"Unknown constant-expr.\n",0x18);
        goto LAB_001487a6;
      }
      pBVar22 = Converter::Impl::builder(impl);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      pTVar13 = LLVMBC::Type::getPointerElementType(pTVar13);
      IVar7 = Converter::Impl::get_type_id(impl,pTVar13,0);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar7 = resolve_llvm_actual_value_type(impl,(Value *)cexpr,&pCVar14->super_Value,IVar7);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      SVar8 = spv::Builder::getStorageClass(pBVar22,IVar10);
      SVar8 = Converter::Impl::get_effective_storage_class(impl,&pCVar14->super_Value,SVar8);
      IVar7 = spv::Builder::makePointer(pBVar22,SVar8,IVar7);
      pOVar21 = Converter::Impl::allocate(impl,OpAccessChain,IVar7);
      Operation::add_id(pOVar21,IVar10);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
      bVar1 = LLVMBC::isa<LLVMBC::ConstantInt>(&pCVar14->super_Value);
      if (bVar1) {
        pCVar14 = &LLVMBC::cast<LLVMBC::ConstantInt>(&pCVar14->super_Value)->super_Constant;
        pAVar15 = LLVMBC::Constant::getUniqueInteger(pCVar14);
        uVar16 = LLVMBC::APInt::getZExtValue(pAVar15);
        if (uVar16 == 0) {
          uVar12 = LLVMBC::ConstantExpr::getNumOperands(cexpr);
          for (uVar5 = 2; uVar5 < uVar12; uVar5 = uVar5 + 1) {
            pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,uVar5);
            IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
            Operation::add_id(pOVar21,IVar10);
          }
          Converter::Impl::add(impl,pOVar21,false);
          goto LAB_00148ae7;
        }
      }
      p_Var19 = get_thread_log_callback();
      if (p_Var19 == (LoggingCallback)0x0) {
        __ptr = "[ERROR]: First GetElementPtr operand is not constant 0.\n";
        sStack_1070 = 0x38;
        goto LAB_00148fc5;
      }
      builtin_strncpy(buffer + 0x23,"constant 0.\n",0xd);
      builtin_strncpy(buffer + 0x10,"Ptr operand is not ",0x13);
      uVar26._0_1_ = 'F';
      uVar26._1_1_ = 'i';
      uVar26._2_1_ = 'r';
      uVar26._3_1_ = 's';
      uVar27._0_1_ = 't';
      uVar27._1_1_ = ' ';
      uVar27._2_1_ = 'G';
      uVar27._3_1_ = 'e';
      uVar28._0_1_ = 't';
      uVar28._1_1_ = 'E';
      uVar28._2_1_ = 'l';
      uVar28._3_1_ = 'e';
      buffer[0xc] = 'm';
      buffer[0xd] = 'e';
      buffer[0xe] = 'n';
      buffer[0xf] = 't';
      goto LAB_001487a2;
    }
    uVar5 = LLVMBC::ConstantExpr::getOpcode(cexpr);
    if (uVar5 == 0x6c) {
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      TVar6 = LLVMBC::Type::getTypeID(pTVar13);
      if (TVar6 == FloatTyID) {
        pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
        TVar6 = LLVMBC::Type::getTypeID(pTVar13);
        if ((TVar6 == HalfTyID) &&
           (bVar1 = Converter::Impl::support_native_fp16_operations(impl), !bVar1)) {
          if ((impl->options).arithmetic_relaxed_precision == true) {
            pOVar21 = Converter::Impl::allocate(impl,OpCopyObject,(Value *)cexpr);
            pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
            IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
            Operation::add_id(pOVar21,IVar10);
            Converter::Impl::add(impl,pOVar21,false);
            IVar10 = pOVar21->id;
            pBVar22 = Converter::Impl::builder(impl);
            spv::Builder::addDecoration(pBVar22,IVar10,DecorationRelaxedPrecision,-1);
            return IVar10;
          }
LAB_00148901:
          pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
          IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
          goto LAB_001489f7;
        }
      }
    }
    else if (uVar5 == 0x6d) {
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      TVar6 = LLVMBC::Type::getTypeID(pTVar13);
      if (TVar6 == FloatTyID) {
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
        pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
        TVar6 = LLVMBC::Type::getTypeID(pTVar13);
        if ((TVar6 == HalfTyID) &&
           (bVar1 = Converter::Impl::support_native_fp16_operations(impl), !bVar1))
        goto LAB_00148901;
      }
    }
    uVar5 = LLVMBC::ConstantExpr::getOpcode(cexpr);
    switch(uVar5) {
    case 0x65:
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) {
        pBVar22 = Converter::Impl::builder(impl);
        pOVar21 = Converter::Impl::allocate(impl,OpINotEqual,(Value *)cexpr);
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
        IVar10 = build_naturally_extended_value(impl,&pCVar14->super_Value,false);
        Operation::add_id(pOVar21,IVar10);
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
        pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
        uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
        if (uVar5 == 1) {
          return 0;
        }
        if (uVar5 != 8) {
          if (uVar5 == 0x10) {
            IVar10 = spv::Builder::makeUint16Constant(pBVar22,0,false);
          }
          else if ((uVar5 == 0x20) || ((uVar5 != 0x40 && (uVar5 < 0x21)))) {
            IVar10 = spv::Builder::makeUintConstant(pBVar22,0,false);
          }
          else {
            IVar10 = spv::Builder::makeUint64Constant(pBVar22,0,false);
          }
          Operation::add_id(pOVar21,IVar10);
          Converter::Impl::add(impl,pOVar21,false);
          return pOVar21->id;
        }
        return 0;
      }
      goto LAB_0014824b;
    case 0x66:
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) {
LAB_00148241:
        bVar1 = false;
LAB_00148297:
        IVar10 = emit_boolean_convert_instruction<LLVMBC::ConstantExpr>(impl,cexpr,bVar1);
        return IVar10;
      }
LAB_0014824b:
      IVar10 = emit_masked_cast_instruction<LLVMBC::ConstantExpr>(impl,cexpr,OpUConvert);
      if (IVar10 != 0) {
        return IVar10;
      }
      local_1050 = OpUConvert;
      break;
    case 0x67:
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) {
LAB_0014828e:
        bVar1 = true;
        goto LAB_00148297;
      }
      IVar10 = emit_masked_cast_instruction<LLVMBC::ConstantExpr>(impl,cexpr,OpSConvert);
      if (IVar10 != 0) {
        return IVar10;
      }
      local_1050 = OpSConvert;
      local_104c = true;
      bVar1 = false;
      goto LAB_001482db;
    case 0x68:
      local_1050 = OpConvertFToU;
      break;
    case 0x69:
      local_1050 = OpConvertFToS;
      break;
    case 0x6a:
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) goto LAB_00148241;
      bVar1 = false;
      local_1050 = OpConvertUToF;
      goto LAB_001482d3;
    case 0x6b:
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) goto LAB_0014828e;
      bVar1 = false;
      local_104c = true;
      local_1050 = OpConvertSToF;
      goto LAB_001482db;
    case 0x6c:
    case 0x6d:
      local_1050 = OpFConvert;
      bVar1 = true;
      goto LAB_001482d3;
    default:
      p_Var19 = get_thread_log_callback();
      if (p_Var19 == (LoggingCallback)0x0) {
        __ptr = "[ERROR]: Unknown cast operation.\n";
        sStack_1070 = 0x21;
        goto LAB_00148fc5;
      }
      builtin_strncpy(buffer + 0x10,"ration.\n",9);
      uVar26._0_1_ = 'U';
      uVar26._1_1_ = 'n';
      uVar26._2_1_ = 'k';
      uVar26._3_1_ = 'n';
      uVar27._0_1_ = 'o';
      uVar27._1_1_ = 'w';
      uVar27._2_1_ = 'n';
      uVar27._3_1_ = ' ';
      uVar28._0_1_ = 'c';
      uVar28._1_1_ = 'a';
      uVar28._2_1_ = 's';
      uVar28._3_1_ = 't';
      buffer[0xc] = ' ';
      buffer[0xd] = 'o';
      buffer[0xe] = 'p';
      buffer[0xf] = 'e';
      goto LAB_001487a2;
    case 0x70:
      local_1050 = OpBitcast;
    }
    bVar1 = false;
LAB_001482d3:
    local_104c = false;
LAB_001482db:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    TVar6 = LLVMBC::Type::getTypeID(pTVar13);
    if (TVar6 == PointerTyID) {
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      uVar5 = LLVMBC::Type::getPointerAddressSpace(pTVar13);
      if ((char)uVar5 == '\x03') {
        uVar16 = 0;
        pCVar17 = cexpr;
        while( true ) {
          pCVar14 = LLVMBC::ConstantExpr::getOperand(pCVar17,0);
          bVar2 = LLVMBC::isa<LLVMBC::ConstantExpr>(&pCVar14->super_Value);
          if (!bVar2) break;
          pCVar17 = LLVMBC::cast<LLVMBC::ConstantExpr>(&pCVar14->super_Value);
          uVar5 = LLVMBC::ConstantExpr::getOpcode(pCVar17);
          if ((uVar5 == 200) && (uVar5 = LLVMBC::ConstantExpr::getNumOperands(pCVar17), uVar5 == 3))
          {
            this = LLVMBC::ConstantExpr::getOperand(pCVar17,2);
            pAVar15 = LLVMBC::Constant::getUniqueInteger(this);
            uVar16 = LLVMBC::APInt::getZExtValue(pAVar15);
          }
          pCVar17 = LLVMBC::cast<LLVMBC::ConstantExpr>(&pCVar14->super_Value);
        }
        pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
        pTVar13 = LLVMBC::Type::getPointerElementType(pTVar13);
        uVar5 = 0;
        while (TVar6 = LLVMBC::Type::getTypeID(pTVar13), TVar6 == ArrayTyID) {
          uVar5 = uVar5 + 1;
          pTVar13 = LLVMBC::Type::getArrayElementType(pTVar13);
        }
        pTVar18 = LLVMBC::Value::getType((Value *)cexpr);
        pTVar18 = LLVMBC::Type::getPointerElementType(pTVar18);
        uVar12 = 0;
        while (TVar6 = LLVMBC::Type::getTypeID(pTVar18), TVar6 == ArrayTyID) {
          uVar12 = uVar12 + 1;
          pTVar18 = LLVMBC::Type::getArrayElementType(pTVar18);
        }
        TVar6 = LLVMBC::Type::getTypeID(pTVar13);
        if ((TVar6 == IntegerTyID) &&
           (uVar9 = LLVMBC::Type::getIntegerBitWidth(pTVar13), uVar9 == 8)) {
          if ((uVar16 & 3) == 0) {
            pBVar22 = Converter::Impl::builder(impl);
            IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
            if (uVar12 < uVar5) {
              iVar25 = uVar5 - uVar12;
              IVar7 = spv::Builder::makeUintType(pBVar22,0x20);
              IVar7 = spv::Builder::makePointer(pBVar22,StorageClassWorkgroup,IVar7);
              pOVar21 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar7);
              Operation::add_id(pOVar21,IVar10);
              local_1048 = uVar16 >> 2 & 0x3fffffff;
              while (bVar2 = iVar25 != 0, iVar25 = iVar25 + -1, bVar2) {
                IVar10 = spv::Builder::makeUintConstant(pBVar22,(uint)local_1048,false);
                Operation::add_id(pOVar21,IVar10);
                local_1048 = 0;
              }
              Converter::Impl::add(impl,pOVar21,false);
              IVar10 = pOVar21->id;
            }
            Converter::Impl::rewrite_value(impl,(Value *)cexpr,IVar10);
            IVar7 = spv::Builder::makeUintType(pBVar22,0x20);
            buffer._0_8_ = cexpr;
            pmVar23 = std::__detail::
                      _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&impl->llvm_value_actual_type,(key_type *)buffer);
            *pmVar23 = IVar7;
            if (IVar10 != 0) {
              return IVar10;
            }
          }
          else {
            p_Var19 = get_thread_log_callback();
            if (p_Var19 == (LoggingCallback)0x0) {
              fwrite("[ERROR]: Expected 4 byte aligned constant gep offset for TGSM.\n",0x3f,1,
                     _stderr);
              fflush(_stderr);
            }
            else {
              builtin_strncpy(buffer,"Expected 4 byte aligned constant gep offset for TGSM.\n",0x37)
              ;
              pvVar20 = get_thread_log_callback_userdata();
              (*p_Var19)(pvVar20,Error,buffer);
            }
          }
        }
      }
    }
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    TVar6 = LLVMBC::Type::getTypeID(pTVar13);
    if (TVar6 == PointerTyID) {
      uVar5 = 0;
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      this_00 = LLVMBC::cast<LLVMBC::PointerType>(pTVar13);
      pTVar13 = LLVMBC::Type::getPointerElementType(&this_00->super_Type);
      pTVar18 = LLVMBC::Value::getType((Value *)cexpr);
      this_01 = LLVMBC::cast<LLVMBC::PointerType>(pTVar18);
      pTVar18 = LLVMBC::Type::getPointerElementType(&this_01->super_Type);
      while (TVar6 = LLVMBC::Type::getTypeID(pTVar13), TVar6 == ArrayTyID) {
        pTVar13 = LLVMBC::Type::getArrayElementType(pTVar13);
        uVar5 = uVar5 + 1;
      }
      uVar12 = 0;
      while (TVar6 = LLVMBC::Type::getTypeID(pTVar18), TVar6 == ArrayTyID) {
        pTVar18 = LLVMBC::Type::getArrayElementType(pTVar18);
        uVar12 = uVar12 + 1;
      }
      TVar6 = LLVMBC::Type::getTypeID(pTVar13);
      if ((TVar6 == PointerTyID) || (TVar6 = LLVMBC::Type::getTypeID(pTVar18), TVar6 == PointerTyID)
         ) {
        p_Var19 = get_thread_log_callback();
        if (p_Var19 == (LoggingCallback)0x0) {
          __ptr = "[ERROR]: Cannot handle pointer-to-pointer.\n";
          sStack_1070 = 0x2b;
          goto LAB_00148fc5;
        }
        builtin_strncpy(buffer,"Cannot handle pointer-to-pointer.\n",0x23);
        goto LAB_001487a6;
      }
      IVar10 = Converter::Impl::get_type_id(impl,pTVar13,0);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar7 = resolve_llvm_actual_value_type(impl,(Value *)cexpr,&pCVar14->super_Value,IVar10);
      uVar9 = LLVMBC::Type::getAddressSpace(&this_00->super_Type);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      SVar8 = Converter::Impl::get_effective_storage_class
                        (impl,&pCVar14->super_Value,
                         (uint)((char)uVar9 != '\x03') * 3 + StorageClassWorkgroup);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
      if (uVar5 == uVar12) {
        bVar1 = LLVMBC::isa<LLVMBC::ConstantExpr>((Value *)cexpr);
        if (bVar1) goto LAB_00148eaf;
        pBVar22 = Converter::Impl::builder(impl);
        IVar11 = spv::Builder::makePointer(pBVar22,SVar8,IVar7);
        pOVar21 = Converter::Impl::allocate(impl,OpCopyObject,(Value *)cexpr,IVar11);
        Operation::add_id(pOVar21,IVar10);
      }
      else {
        if (uVar5 < uVar12) {
          p_Var19 = get_thread_log_callback();
          if (p_Var19 == (LoggingCallback)0x0) {
            __ptr = "[ERROR]: Bitcasting pointer while adding more array dimensions.\n";
            sStack_1070 = 0x40;
LAB_00148fc5:
            fwrite(__ptr,sStack_1070,1,_stderr);
            fflush(_stderr);
            return 0;
          }
          builtin_strncpy(buffer + 8,"ng pointer while adding more array dimensions.\n",0x30);
          buffer[0] = 'B';
          buffer[1] = 'i';
          buffer[2] = 't';
          buffer[3] = 'c';
          buffer[4] = 'a';
          buffer[5] = 's';
          buffer[6] = 't';
          buffer[7] = 'i';
LAB_001487a6:
          pvVar20 = get_thread_log_callback_userdata();
          (*p_Var19)(pvVar20,Error,buffer);
          return 0;
        }
        if (uVar12 != 0) {
          p_Var19 = get_thread_log_callback();
          if (p_Var19 == (LoggingCallback)0x0) {
            __ptr = "[ERROR]: Bitcasting pointer to unexpected number of array dimensions.\n";
            sStack_1070 = 0x46;
            goto LAB_00148fc5;
          }
          builtin_strncpy(buffer + 0x23,"mber of array dimensions.\n",0x1b);
          builtin_strncpy(buffer + 0x10,"er to unexpected nu",0x13);
          uVar26._0_1_ = 'B';
          uVar26._1_1_ = 'i';
          uVar26._2_1_ = 't';
          uVar26._3_1_ = 'c';
          uVar27._0_1_ = 'a';
          uVar27._1_1_ = 's';
          uVar27._2_1_ = 't';
          uVar27._3_1_ = 'i';
          uVar28._0_1_ = 'n';
          uVar28._1_1_ = 'g';
          uVar28._2_1_ = ' ';
          uVar28._3_1_ = 'p';
          buffer[0xc] = 'o';
          buffer[0xd] = 'i';
          buffer[0xe] = 'n';
          buffer[0xf] = 't';
LAB_001487a2:
          buffer[4] = (char)uVar27;
          buffer[5] = SUB41(uVar27,1);
          buffer[6] = SUB41(uVar27,2);
          buffer[7] = SUB41(uVar27,3);
          buffer[0] = (char)uVar26;
          buffer[1] = SUB41(uVar26,1);
          buffer[2] = SUB41(uVar26,2);
          buffer[3] = SUB41(uVar26,3);
          buffer[8] = (char)uVar28;
          buffer[9] = SUB41(uVar28,1);
          buffer._10_2_ = SUB42(uVar28,2);
          goto LAB_001487a6;
        }
        pBVar22 = Converter::Impl::builder(impl);
        IVar11 = spv::Builder::makePointer(pBVar22,SVar8,IVar7);
        pOVar21 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar11);
        while( true ) {
          Operation::add_id(pOVar21,IVar10);
          bVar1 = uVar5 == 0;
          uVar5 = uVar5 - 1;
          if (bVar1) break;
          pBVar22 = Converter::Impl::builder(impl);
          IVar10 = spv::Builder::makeUintConstant(pBVar22,0,false);
        }
      }
      Converter::Impl::add(impl,pOVar21,false);
      IVar10 = pOVar21->id;
LAB_00148eaf:
      buffer._0_8_ = cexpr;
      pmVar23 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_value_actual_type,(key_type *)buffer);
      *pmVar23 = IVar7;
      buffer._0_8_ = cexpr;
      pmVar24 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_storage_class,(key_type *)buffer);
      *pmVar24 = SVar8;
      return IVar10;
    }
    bVar2 = LLVMBC::isa<LLVMBC::ConstantExpr>((Value *)cexpr);
    if (bVar2) {
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      IVar10 = Converter::Impl::get_type_id(impl,pTVar13,0);
      pOVar21 = Converter::Impl::allocate(impl,local_1050,IVar10);
    }
    else {
      pOVar21 = Converter::Impl::allocate(impl,local_1050,(Value *)cexpr);
    }
    pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
    IVar10 = build_naturally_extended_value(impl,&pCVar14->super_Value,local_104c);
    Operation::add_id(pOVar21,IVar10);
    Converter::Impl::add(impl,pOVar21,false);
    if (!bVar1) goto LAB_00148ae7;
    goto LAB_00148ace;
  }
  uVar5 = LLVMBC::ConstantExpr::getOpcode(cexpr);
  switch(uVar5) {
  case 0x12d:
    op = OpIAdd;
    break;
  case 0x12e:
    bVar1 = true;
    op = OpFAdd;
    goto LAB_00148955;
  case 0x12f:
    op = OpISub;
    break;
  case 0x130:
    bVar1 = true;
    op = OpFSub;
    goto LAB_00148955;
  case 0x131:
    op = OpIMul;
    break;
  case 0x132:
    bVar1 = true;
    op = OpFMul;
    goto LAB_00148955;
  case 0x133:
    op = OpUDiv;
    goto LAB_0014876c;
  case 0x134:
    op = OpSDiv;
    goto LAB_001487ca;
  case 0x135:
    bVar1 = true;
    op = OpFDiv;
    goto LAB_00148955;
  case 0x136:
    op = OpUMod;
    goto LAB_0014876c;
  case 0x137:
    op = OpSRem;
    goto LAB_001487ca;
  case 0x138:
    bVar1 = true;
    op = OpFRem;
    goto LAB_00148955;
  case 0x139:
    op = OpShiftLeftLogical;
    break;
  case 0x13a:
    op = OpShiftRightLogical;
LAB_0014876c:
    bVar2 = true;
    bVar1 = false;
    goto LAB_0014895d;
  case 0x13b:
    op = OpShiftRightArithmetic;
LAB_001487ca:
    bVar2 = true;
    bVar1 = false;
    is_signed = true;
    goto LAB_0014895f;
  case 0x13c:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
    op = (uint)(uVar5 != 1) * 0x20 + OpLogicalAnd;
    break;
  case 0x13d:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
    op = OpBitwiseOr;
    if (uVar5 == 1) {
      op = OpLogicalOr;
    }
    break;
  case 0x13e:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
    if (uVar5 == 1) {
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pCVar14 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(&pCVar14->super_Value)->super_Constant;
      if (pCVar14 == (Constant *)0x0) {
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
        pCVar14 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(&pCVar14->super_Value)->super_Constant;
        uVar5 = 0;
        op = OpLogicalNotEqual;
        if (pCVar14 != (Constant *)0x0) {
          pAVar15 = LLVMBC::Constant::getUniqueInteger(pCVar14);
          uVar16 = LLVMBC::APInt::getZExtValue(pAVar15);
          if (uVar16 != 0) goto LAB_00148c7b;
        }
      }
      else {
        pAVar15 = LLVMBC::Constant::getUniqueInteger(pCVar14);
        uVar16 = LLVMBC::APInt::getZExtValue(pAVar15);
        if (uVar16 != 0) {
          uVar5 = 1;
LAB_00148c7b:
          pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,uVar5);
          IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
          if (IVar10 != 0) {
            bVar1 = LLVMBC::isa<LLVMBC::ConstantExpr>((Value *)cexpr);
            if (bVar1) {
              pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
              IVar7 = Converter::Impl::get_type_id(impl,pTVar13,0);
              pOVar21 = Converter::Impl::allocate(impl,OpLogicalNot,IVar7);
            }
            else {
              pOVar21 = Converter::Impl::allocate(impl,OpLogicalNot,(Value *)cexpr);
            }
            Operation::add_id(pOVar21,IVar10);
            Converter::Impl::add(impl,pOVar21,false);
            return pOVar21->id;
          }
          bVar1 = false;
          op = OpLogicalNotEqual;
          goto LAB_00148955;
        }
        op = OpLogicalNotEqual;
      }
    }
    else {
      op = OpBitwiseXor;
    }
    break;
  default:
    p_Var19 = get_thread_log_callback();
    if (p_Var19 == (LoggingCallback)0x0) {
      __ptr = "[ERROR]: Unknown binary operator.\n";
      sStack_1070 = 0x22;
      goto LAB_00148fc5;
    }
    builtin_strncpy(buffer + 0x10,"perator.\n",10);
    uVar26._0_1_ = 'U';
    uVar26._1_1_ = 'n';
    uVar26._2_1_ = 'k';
    uVar26._3_1_ = 'n';
    uVar27._0_1_ = 'o';
    uVar27._1_1_ = 'w';
    uVar27._2_1_ = 'n';
    uVar27._3_1_ = ' ';
    uVar28._0_1_ = 'b';
    uVar28._1_1_ = 'i';
    uVar28._2_1_ = 'n';
    uVar28._3_1_ = 'a';
    buffer[0xc] = 'r';
    buffer[0xd] = 'y';
    buffer[0xe] = ' ';
    buffer[0xf] = 'o';
    goto LAB_001487a2;
  }
  bVar1 = false;
LAB_00148955:
  bVar2 = false;
LAB_0014895d:
  is_signed = false;
LAB_0014895f:
  IVar10 = 0;
  pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
  bVar3 = instruction_is_undefined_value(&pCVar14->super_Value);
  pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
  bVar4 = instruction_is_undefined_value(&pCVar14->super_Value);
  if (bVar3 || bVar4) {
    pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,(uint)!bVar4);
    IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
  }
  bVar3 = LLVMBC::isa<LLVMBC::ConstantExpr>((Value *)cexpr);
  if (bVar3) {
    if (IVar10 != 0) {
      return IVar10;
    }
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    IVar10 = Converter::Impl::get_type_id(impl,pTVar13,0);
    pOVar21 = Converter::Impl::allocate(impl,op,IVar10);
  }
  else {
    if (IVar10 != 0) {
LAB_001489f7:
      Converter::Impl::rewrite_value(impl,(Value *)cexpr,IVar10);
      return IVar10;
    }
    pOVar21 = Converter::Impl::allocate(impl,op,(Value *)cexpr);
  }
  pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
  if (bVar2) {
    IVar10 = build_naturally_extended_value(impl,&pCVar14->super_Value,is_signed);
    pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
    local_103c = build_naturally_extended_value(impl,&pCVar14->super_Value,is_signed);
  }
  else {
    IVar10 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
    pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
    local_103c = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
  }
  buffer._0_8_ = &local_1040;
  buffer[8] = '\x02';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  local_1040 = IVar10;
  Operation::add_ids(pOVar21,(initializer_list<unsigned_int> *)buffer);
  Converter::Impl::add(impl,pOVar21,false);
  if (bVar1) {
    pBVar22 = Converter::Impl::builder(impl);
    spv::Builder::addDecoration(pBVar22,pOVar21->id,DecorationNoContraction,-1);
LAB_00148ace:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    Converter::Impl::decorate_relaxed_precision(impl,pTVar13,pOVar21->id,false);
  }
LAB_00148ae7:
  return pOVar21->id;
}

Assistant:

spv::Id build_constant_expression(Converter::Impl &impl, const llvm::ConstantExpr *cexpr)
{
	switch (cexpr->getOpcode())
	{
	case llvm::Instruction::GetElementPtr:
		return build_constant_getelementptr(impl, cexpr);

	case llvm::Instruction::Trunc:
	case llvm::Instruction::ZExt:
	case llvm::Instruction::SExt:
	case llvm::Instruction::FPToUI:
	case llvm::Instruction::FPToSI:
	case llvm::Instruction::UIToFP:
	case llvm::Instruction::SIToFP:
	case llvm::Instruction::FPTrunc:
	case llvm::Instruction::FPExt:
	case llvm::Instruction::PtrToInt:
	case llvm::Instruction::IntToPtr:
	case llvm::Instruction::BitCast:
	case llvm::Instruction::AddrSpaceCast:
		return build_constant_cast(impl, cexpr);

	case llvm::Instruction::Add:
	case llvm::Instruction::FAdd:
	case llvm::Instruction::Sub:
	case llvm::Instruction::FSub:
	case llvm::Instruction::Mul:
	case llvm::Instruction::FMul:
	case llvm::Instruction::UDiv:
	case llvm::Instruction::SDiv:
	case llvm::Instruction::FDiv:
	case llvm::Instruction::URem:
	case llvm::Instruction::SRem:
	case llvm::Instruction::FRem:
	case llvm::Instruction::Shl:
	case llvm::Instruction::LShr:
	case llvm::Instruction::AShr:
	case llvm::Instruction::And:
	case llvm::Instruction::Or:
	case llvm::Instruction::Xor:
		return emit_binary_instruction_impl(impl, cexpr);

	default:
	{
		LOGE("Unknown constant-expr.\n");
		break;
	}
	}

	return 0;
}